

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O2

void read_engr_at(int x,int y)

{
  boolean bVar1;
  engr *peVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  level *lev;
  char buf [256];
  char local_138 [231];
  undefined1 local_51;
  
  lev = level;
  peVar2 = engr_at(level,(xchar)x,(xchar)y);
  if (peVar2 == (engr *)0x0) {
    return;
  }
  if (*peVar2->engr_txt == '\0') {
    return;
  }
  if ((flags.run == 8) && ((lev->locations[x][y].field_0x6 & 4) != 0)) {
    return;
  }
  switch(peVar2->engr_type) {
  case '\x01':
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00193aae;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00193aa5;
    }
    else {
LAB_00193aa5:
      if (ublindf == (obj *)0x0) {
        return;
      }
LAB_00193aae:
      if (ublindf->oartifact != '\x1d') {
        return;
      }
    }
    is_ice(lev,x,y);
    pcVar5 = "Something is written here in the %s.";
    goto LAB_00193ca2;
  case '\x02':
  case '\x06':
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00193a28;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00193a23;
    }
    else {
LAB_00193a23:
      if (ublindf != (obj *)0x0) {
LAB_00193a28:
        if (ublindf->oartifact == '\x1d') goto LAB_00193b62;
      }
      bVar1 = can_reach_floor();
      if (bVar1 == '\0') {
        return;
      }
    }
LAB_00193b62:
    surface(x,y);
    pcVar5 = "Something is engraved here on the %s.";
    goto LAB_00193ca2;
  case '\x03':
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00193a67;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00193a62;
    }
    else {
LAB_00193a62:
      if (ublindf != (obj *)0x0) {
LAB_00193a67:
        if (ublindf->oartifact == '\x1d') goto LAB_00193b9e;
      }
      bVar1 = can_reach_floor();
      lev = level;
      if (bVar1 == '\0') {
        return;
      }
    }
LAB_00193b9e:
    bVar1 = is_ice(lev,x,y);
    pcVar5 = "melted";
    if (bVar1 == '\0') {
      pcVar5 = "burned";
    }
    pcVar4 = surface(x,y);
    pline("Some text has been %s into the %s here.",pcVar5,pcVar4);
    break;
  case '\x04':
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00193b2d;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00193b24;
    }
    else {
LAB_00193b24:
      if (ublindf == (obj *)0x0) {
        return;
      }
LAB_00193b2d:
      if (ublindf->oartifact != '\x1d') {
        return;
      }
    }
    surface(x,y);
    pcVar5 = "There\'s some graffiti on the %s here.";
LAB_00193ca2:
    pline(pcVar5);
    break;
  case '\x05':
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00193ae4;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00193adb;
    }
    else {
LAB_00193adb:
      if (ublindf == (obj *)0x0) {
        return;
      }
LAB_00193ae4:
      if (ublindf->oartifact != '\x1d') {
        return;
      }
    }
    pline("You see a message scrawled in blood here.");
    break;
  default:
    warning("Something is written in a very strange way.");
  }
  pcVar5 = peVar2->engr_txt;
  sVar3 = strlen(pcVar5);
  if (0xe7 < sVar3) {
    strncpy(local_138,pcVar5,0xe7);
    local_51 = 0;
    pcVar5 = local_138;
  }
  if ((u.roleplay.illiterate != '\0') && ((*pcVar5 != 'X' || (pcVar5[1] != '\0')))) {
    pline("But you cannot read.");
    goto LAB_00193d75;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00193d1e;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00193d19;
    pcVar4 = "read";
  }
  else {
LAB_00193d19:
    if (ublindf == (obj *)0x0) {
      pcVar4 = "feel the words";
    }
    else {
LAB_00193d1e:
      pcVar4 = "feel the words";
      if (ublindf->oartifact == '\x1d') {
        pcVar4 = "read";
      }
    }
  }
  pline("You %s: \"%s\".",pcVar4,pcVar5);
LAB_00193d75:
  if (1 < flags.run) {
    nomul(0,(char *)0x0);
  }
  if (5 < moves) {
    check_tutorial_message(0x14f);
  }
  return;
}

Assistant:

void read_engr_at(int x, int y)
{
	struct engr *ep = engr_at(level, x,y);
	int	sensed = 0;
	char buf[BUFSZ];
	
	/* Sensing an engraving does not require sight,
	 * nor does it necessarily imply comprehension (literacy).
	 */
	if (ep && ep->engr_txt[0] &&
	    /* Don't stop if travelling or autoexploring. */
	    !(flags.run == 8 && level->locations[x][y].mem_stepped)) {
	    switch(ep->engr_type) {
	    case DUST:
		if (!Blind) {
			sensed = 1;
			pline("Something is written here in the %s.",
				is_ice(level, x, y) ? "frost" : "dust");
		}
		break;
	    case ENGRAVE:
	    case HEADSTONE:
		if (!Blind || can_reach_floor()) {
			sensed = 1;
			pline("Something is engraved here on the %s.",
				surface(x,y));
		}
		break;
	    case BURN:
		if (!Blind || can_reach_floor()) {
			sensed = 1;
			pline("Some text has been %s into the %s here.",
				is_ice(level, x, y) ? "melted" : "burned",
				surface(x, y));
		}
		break;
	    case MARK:
		if (!Blind) {
			sensed = 1;
			pline("There's some graffiti on the %s here.",
				surface(x,y));
		}
		break;
	    case ENGR_BLOOD:
		/* "It's a message!  Scrawled in blood!"
		 * "What's it say?"
		 * "It says... `See you next Wednesday.'" -- Thriller
		 */
		if (!Blind) {
			sensed = 1;
			pline("You see a message scrawled in blood here.");
		}
		break;
	    default:
		warning("Something is written in a very strange way.");
		sensed = 1;
	    }
	    if (sensed) {
		char *et;
		unsigned maxelen = BUFSZ - sizeof("You feel the words: \"\". ");
		if (strlen(ep->engr_txt) > maxelen) {
			strncpy(buf,  ep->engr_txt, (int)maxelen);
			buf[maxelen] = '\0';
			et = buf;
		} else
			et = ep->engr_txt;
		if (u.roleplay.illiterate && strcmp(et, "X")) {
		    pline("But you cannot read.");
		} else {
		    pline("You %s: \"%s\".",
			  (Blind) ? "feel the words" : "read",  et);
		}
		if (flags.run > 1) nomul(0, NULL);
		if (moves > 5) check_tutorial_message(QT_T_ENGRAVING);
	    }
	}
}